

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parser.cpp
# Opt level: O2

MPP_RET mpp_parser_init(Parser *prs,ParserCfg *cfg)

{
  long lVar1;
  MPP_RET MVar2;
  long *ptr;
  void *ptr_00;
  long lVar3;
  
  if (prs == (Parser *)0x0 || cfg == (ParserCfg *)0x0) {
    _mpp_log_l(2,"mpp_dec","found NULL input parser %p config %p\n","mpp_parser_init",prs,cfg);
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    *prs = (Parser)0x0;
    lVar3 = 0;
    do {
      if (lVar3 == 0x68) {
        return MPP_NOK;
      }
      lVar1 = *(long *)((long)parsers + lVar3);
      lVar3 = lVar3 + 8;
    } while (cfg->coding != *(MppCodingType *)(lVar1 + 8));
    ptr = (long *)mpp_osal_calloc("mpp_parser_init",0x10);
    ptr_00 = mpp_osal_calloc("mpp_parser_init",(ulong)*(uint *)(lVar1 + 0xc));
    if (ptr == (long *)0x0 || ptr_00 == (void *)0x0) {
      _mpp_log_l(2,"mpp_dec","failed to alloc parser context\n","mpp_parser_init");
      mpp_osal_free("mpp_parser_init",ptr);
      mpp_osal_free("mpp_parser_init",ptr_00);
      MVar2 = MPP_ERR_MALLOC;
    }
    else {
      MVar2 = (**(code **)(lVar1 + 0x18))(ptr_00,cfg);
      if (MVar2 == MPP_OK) {
        *ptr = lVar1;
        ptr[1] = (long)ptr_00;
        *prs = ptr;
        MVar2 = MPP_OK;
      }
      else {
        _mpp_log_l(2,"mpp_dec","failed to init parser\n","mpp_parser_init");
        mpp_osal_free("mpp_parser_init",ptr);
        mpp_osal_free("mpp_parser_init",ptr_00);
      }
    }
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_parser_init(Parser *prs, ParserCfg *cfg)
{
    if (NULL == prs || NULL == cfg) {
        mpp_err_f("found NULL input parser %p config %p\n", prs, cfg);
        return MPP_ERR_NULL_PTR;
    }

    *prs = NULL;

    RK_U32 i;
    for (i = 0; i < MPP_ARRAY_ELEMS(parsers); i++) {
        const ParserApi *api = parsers[i];
        if (cfg->coding == api->coding) {
            ParserImpl *p = mpp_calloc(ParserImpl, 1);
            void *ctx = mpp_calloc_size(void, api->ctx_size);
            if (NULL == ctx || NULL == p) {
                mpp_err_f("failed to alloc parser context\n");
                mpp_free(p);
                mpp_free(ctx);
                return MPP_ERR_MALLOC;
            }

            MPP_RET ret = api->init(ctx, cfg);
            if (MPP_OK != ret) {
                mpp_err_f("failed to init parser\n");
                mpp_free(p);
                mpp_free(ctx);
                return ret;
            }

            p->api  = api;
            p->ctx  = ctx;
            *prs = p;
            return MPP_OK;
        }
    }
    return MPP_NOK;
}